

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

string * __thiscall MlmWrap::error(string *__return_storage_ptr__,MlmWrap *this,string *s)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"[MlmWrap:","");
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,(ulong)(this->id)._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_78 = *plVar3;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar3;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)(s->_M_dataplus)._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MlmWrap::error(const std::string s){
    return std::string("[MlmWrap:") + id + "] " + s;
}